

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  pointer pcVar2;
  ostream *poVar3;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_b0 [8];
  char local_a8 [16];
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  sVar1 = (totals->assertions).failed;
  if ((totals->assertions).passed + sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).stream,"No tests ran",0xc);
    return;
  }
  if (sVar1 == 0) {
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x13);
    poVar3 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All tests passed (",0x12);
    pcVar2 = (pointer)(totals->assertions).passed;
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"assertion","");
    local_c0 = (undefined1  [8])pcVar2;
    local_b8._M_p = local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_78,local_78 + local_70);
    poVar3 = operator<<(poVar3,(pluralise *)local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
    sVar1 = (totals->testCases).passed;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test case","");
    local_58 = (undefined1  [8])sVar1;
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_98 + local_90);
    poVar3 = operator<<(poVar3,(pluralise *)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
  }
  else {
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x12);
    local_c0 = (undefined1  [8])local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"test case","");
    printCounts(this,(string *)local_c0,&totals->testCases);
    if (local_c0 != (undefined1  [8])local_b0) {
      operator_delete((void *)local_c0);
    }
    if ((totals->testCases).failed != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_StreamingReporterBase).stream," (",2);
      local_c0 = (undefined1  [8])local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"assertion","");
      printCounts(this,(string *)local_c0,&totals->assertions);
      if (local_c0 != (undefined1  [8])local_b0) {
        operator_delete((void *)local_c0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_StreamingReporterBase).stream,")",1);
    }
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
  }
  return;
}

Assistant:

void printTotals( const Totals& totals ) {
            if( totals.assertions.total() == 0 ) {
                stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                printCounts( "test case", totals.testCases );
                if( totals.testCases.failed > 0 ) {
                    stream << " (";
                    printCounts( "assertion", totals.assertions );
                    stream << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream << "All tests passed ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }